

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O1

void __thiscall
HashtableTest_SimpleDataTypeOptimizations_Test::TestBody
          (HashtableTest_SimpleDataTypeOptimizations_Test *this)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  value_type *pvVar4;
  value_type *pvVar5;
  value_type *pvVar6;
  int iVar7;
  char *pcVar8;
  AssertionResult gtest_ar;
  int nomemmove_copies;
  int memmove_copies;
  int memmove_nonstandard_alloc_copies;
  sparse_hash_map<int,_NoMemmove,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_NoMemmove>_>_>
  nomemmove;
  sparse_hash_map<int,_Memmove,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  memmove_nonstandard_alloc;
  sparse_hash_map<int,_Memmove,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_Memmove>_>_>
  memmove;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_1c8;
  long *local_1b8;
  int local_1b0;
  int local_1a8;
  int local_1a4;
  Hasher local_1a0;
  int local_194;
  sparse_hashtable<std::pair<const_int,_NoMemmove>,_int,_Hasher,_google::sparse_hash_map<int,_NoMemmove,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_NoMemmove>_>_>::SelectKey,_google::sparse_hash_map<int,_NoMemmove,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_NoMemmove>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_NoMemmove>_>_>
  local_190;
  sparse_hashtable<std::pair<const_int,_Memmove>,_int,_Hasher,_google::sparse_hash_map<int,_Memmove,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_Memmove,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_120;
  sparse_hashtable<std::pair<const_int,_Memmove>,_int,_Hasher,_google::sparse_hash_map<int,_Memmove,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_Memmove>_>_>::SelectKey,_google::sparse_hash_map<int,_Memmove,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_Memmove>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_Memmove>_>_>
  local_90;
  
  local_120.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher.id_ = 0
  ;
  local_120.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher.
  num_hashes_ = 0;
  local_120.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher.
  num_compares_ = 0;
  local_190.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher.id_ = 0
  ;
  local_190.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher.
  num_hashes_ = 0;
  local_190.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher.
  num_compares_ = 0;
  google::
  sparse_hashtable<std::pair<const_int,_Memmove>,_int,_Hasher,_google::sparse_hash_map<int,_Memmove,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_Memmove>_>_>::SelectKey,_google::sparse_hash_map<int,_Memmove,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_Memmove>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_Memmove>_>_>
  ::sparse_hashtable(&local_90,0,(Hasher *)&local_120,(Hasher *)&local_190,(SelectKey *)&local_1c8,
                     (SetKey *)&local_1b8,
                     (libc_allocator_with_realloc<std::pair<const_int,_Memmove>_> *)&local_1a0);
  local_120.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher.id_ = 0
  ;
  local_120.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher.
  num_hashes_ = 0;
  local_120.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher.
  num_compares_ = 0;
  local_1c8._0_8_ = 0;
  local_1c8.count_ = (int *)((ulong)local_1c8.count_._4_4_ << 0x20);
  google::
  sparse_hashtable<std::pair<const_int,_NoMemmove>,_int,_Hasher,_google::sparse_hash_map<int,_NoMemmove,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_NoMemmove>_>_>::SelectKey,_google::sparse_hash_map<int,_NoMemmove,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_NoMemmove>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_NoMemmove>_>_>
  ::sparse_hashtable(&local_190,0,(Hasher *)&local_120,(Hasher *)&local_1c8,(SelectKey *)&local_1b8,
                     (SetKey *)&local_1a0,
                     (libc_allocator_with_realloc<std::pair<const_int,_NoMemmove>_> *)&local_1a4);
  local_1b8 = (long *)0x0;
  local_1b0 = 0;
  local_1a0.id_ = 0;
  local_1a0.num_hashes_ = 0;
  local_1a0.num_compares_ = 0;
  local_1c8._0_8_ = local_1c8._0_8_ & 0xffffffff00000000;
  local_1c8.count_ = (int *)0x0;
  google::
  sparse_hashtable<std::pair<const_int,_Memmove>,_int,_Hasher,_google::sparse_hash_map<int,_Memmove,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_Memmove,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::sparse_hashtable(&local_120,0,(Hasher *)&local_1b8,&local_1a0,(SelectKey *)&local_1a4,
                     (SetKey *)&local_1a8,&local_1c8);
  Memmove::num_copies = 0;
  local_1c8.id_ = 10000;
  do {
    iVar7 = local_1c8.id_;
    pvVar4 = google::
             sparse_hashtable<std::pair<int_const,Memmove>,int,Hasher,google::sparse_hash_map<int,Memmove,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,Memmove>>>::SelectKey,google::sparse_hash_map<int,Memmove,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,Memmove>>>::SetKey,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,Memmove>>>
             ::
             find_or_insert<google::sparse_hash_map<int,Memmove,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,Memmove>>>::DefaultValue>
                       ((sparse_hashtable<std::pair<int_const,Memmove>,int,Hasher,google::sparse_hash_map<int,Memmove,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,Memmove>>>::SelectKey,google::sparse_hash_map<int,Memmove,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,Memmove>>>::SetKey,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,Memmove>>>
                         *)&local_90,&local_1c8.id_);
    (pvVar4->second).i = iVar7;
    bVar1 = 1 < local_1c8.id_;
    local_1c8.id_ = local_1c8.id_ + -1;
  } while (bVar1);
  local_1a4 = Memmove::num_copies;
  NoMemmove::num_copies = 0;
  local_1c8.id_ = 10000;
  do {
    iVar7 = local_1c8.id_;
    pvVar5 = google::
             sparse_hashtable<std::pair<int_const,NoMemmove>,int,Hasher,google::sparse_hash_map<int,NoMemmove,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,NoMemmove>>>::SelectKey,google::sparse_hash_map<int,NoMemmove,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,NoMemmove>>>::SetKey,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,NoMemmove>>>
             ::
             find_or_insert<google::sparse_hash_map<int,NoMemmove,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,NoMemmove>>>::DefaultValue>
                       ((sparse_hashtable<std::pair<int_const,NoMemmove>,int,Hasher,google::sparse_hash_map<int,NoMemmove,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,NoMemmove>>>::SelectKey,google::sparse_hash_map<int,NoMemmove,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,NoMemmove>>>::SetKey,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,NoMemmove>>>
                         *)&local_190,&local_1c8.id_);
    (pvVar5->second).i = iVar7;
    bVar1 = 1 < local_1c8.id_;
    local_1c8.id_ = local_1c8.id_ + -1;
  } while (bVar1);
  local_1a8 = NoMemmove::num_copies;
  Memmove::num_copies = 0;
  local_1c8.id_ = 10000;
  iVar7 = 10000;
  do {
    pvVar6 = google::
             sparse_hashtable<std::pair<int_const,Memmove>,int,Hasher,google::sparse_hash_map<int,Memmove,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::sparse_hash_map<int,Memmove,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
             ::
             find_or_insert<google::sparse_hash_map<int,Memmove,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::DefaultValue>
                       ((sparse_hashtable<std::pair<int_const,Memmove>,int,Hasher,google::sparse_hash_map<int,Memmove,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::sparse_hash_map<int,Memmove,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                         *)&local_120,&local_1c8.id_);
    (pvVar6->second).i = iVar7;
    iVar2 = local_1c8.id_;
    iVar7 = local_1c8.id_ + -1;
    local_1c8.id_ = iVar7;
  } while (1 < iVar2);
  local_194 = Memmove::num_copies;
  testing::internal::CmpHelperGT<int,int>
            ((internal *)&local_1c8,"nomemmove_copies","memmove_copies",&local_1a8,&local_1a4);
  if ((char)local_1c8.id_ == '\0') {
    testing::Message::Message((Message *)&local_1b8);
    if (local_1c8.count_ == (int *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)local_1c8.count_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x699,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1a0,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1a0);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8 !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*local_1b8 + 8))();
    }
  }
  piVar3 = local_1c8.count_;
  if (local_1c8.count_ != (int *)0x0) {
    if (*(int **)local_1c8.count_ != local_1c8.count_ + 4) {
      operator_delete(*(int **)local_1c8.count_);
    }
    operator_delete(piVar3);
  }
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_1c8,"nomemmove_copies","memmove_nonstandard_alloc_copies",&local_1a8
             ,&local_194);
  if ((char)local_1c8.id_ == '\0') {
    testing::Message::Message((Message *)&local_1b8);
    if (local_1c8.count_ == (int *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)local_1c8.count_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x69a,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1a0,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1a0);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8 !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*local_1b8 + 8))();
    }
  }
  piVar3 = local_1c8.count_;
  if (local_1c8.count_ != (int *)0x0) {
    if (*(int **)local_1c8.count_ != local_1c8.count_ + 4) {
      operator_delete(*(int **)local_1c8.count_);
    }
    operator_delete(piVar3);
  }
  std::
  vector<google::sparsegroup<std::pair<const_int,_Memmove>,_(unsigned_short)48,_Alloc<std::pair<const_int,_Memmove>,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<std::pair<const_int,_Memmove>,_(unsigned_short)48,_Alloc<std::pair<const_int,_Memmove>,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~vector(&local_120.table.groups);
  std::
  vector<google::sparsegroup<std::pair<const_int,_NoMemmove>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_NoMemmove>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_int,_NoMemmove>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_NoMemmove>_>_>_>_>
  ::~vector(&local_190.table.groups);
  std::
  vector<google::sparsegroup<std::pair<const_int,_Memmove>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_Memmove>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_int,_Memmove>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_Memmove>_>_>_>_>
  ::~vector(&local_90.table.groups);
  return;
}

Assistant:

TEST(HashtableTest, SimpleDataTypeOptimizations) {
  // Only sparsehashtable optimizes moves in this way.
  sparse_hash_map<int, Memmove, Hasher, Hasher> memmove;
  sparse_hash_map<int, NoMemmove, Hasher, Hasher> nomemmove;
  sparse_hash_map<int, Memmove, Hasher, Hasher, Alloc<int>>
      memmove_nonstandard_alloc;

  Memmove::num_copies = 0;
  for (int i = 10000; i > 0; i--) {
    memmove[i] = Memmove(i);
  }
  const int memmove_copies = Memmove::num_copies;

  NoMemmove::num_copies = 0;
  for (int i = 10000; i > 0; i--) {
    nomemmove[i] = NoMemmove(i);
  }
  const int nomemmove_copies = NoMemmove::num_copies;

  Memmove::num_copies = 0;
  for (int i = 10000; i > 0; i--) {
    memmove_nonstandard_alloc[i] = Memmove(i);
  }
  const int memmove_nonstandard_alloc_copies = Memmove::num_copies;

  EXPECT_GT(nomemmove_copies, memmove_copies);
  EXPECT_EQ(nomemmove_copies, memmove_nonstandard_alloc_copies);
}